

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

bool __thiscall Jupiter::IRC::Client::readConfigBool(Client *this,string_view key,bool defaultValue)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  string_view sVar2;
  
  if (this->m_primary_section != (Config *)0x0) {
    sVar2 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0));
    in_string._M_str = sVar2._M_str;
    if ((Jupiter *)sVar2._M_len != (Jupiter *)0x0) {
      in_string._M_len = (size_t)in_string._M_str;
      bVar1 = asBool<char>((Jupiter *)sVar2._M_len,in_string);
      return bVar1;
    }
  }
  if (this->m_secondary_section != (Config *)0x0) {
    bVar1 = Config::get<bool>(this->m_secondary_section,key,defaultValue);
    return bVar1;
  }
  return defaultValue;
}

Assistant:

bool Jupiter::IRC::Client::readConfigBool(std::string_view key, bool defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<bool>(val);
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get<bool>(key, defaultValue);
	}

	return defaultValue;
}